

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivConstantBound.cpp
# Opt level: O3

void TPZShapeHDivConstantBound<pzshape::TPZShapePoint>::Initialize
               (TPZVec<long> *ids,int connectorder,int sideorient,TPZShapeData *data)

{
  int local_1c;
  
  local_1c = connectorder;
  TPZManVector<int,_20>::Resize(&data->fSideOrient,1);
  *(data->fSideOrient).super_TPZVec<int>.fStore = sideorient;
  TPZManVector<int,_27>::Resize(&data->fH1ConnectOrders,0,&local_1c);
  TPZVec<int>::Fill(&(data->fH1ConnectOrders).super_TPZVec<int>,&local_1c,0,-1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDivConstantBound.cpp"
             ,0x29);
}

Assistant:

void TPZShapeHDivConstantBound<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           int connectorder, int sideorient,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
#ifdef PZDEBUG
    if(ids.size() != ncorner || connectorder < 0 || std::abs(sideorient) != 1)
    {
        DebugStop();
    }
#endif
    if(TSHAPE::Type() == ETriangle || TSHAPE::Type() == EOned) connectorder++;

    data.fSideOrient.Resize(1);
    data.fSideOrient[0] = sideorient;
    data.fH1ConnectOrders.Resize(nsides-ncorner, connectorder);
    data.fH1ConnectOrders.Fill(connectorder);

    if(TSHAPE::Dimension == 1)
    {
        TPZShapeH1<TSHAPE>::Initialize(ids,data.fH1ConnectOrders,data);
    } else if (TSHAPE::Dimension == 2){
        const int nedges = TSHAPE::NSides-TSHAPE::NFacets-TSHAPE::NCornerNodes-1;
        TPZManVector<int,15> locconorders(TSHAPE::NSides-TSHAPE::NCornerNodes,1);
        for(int ic = nedges; ic<TSHAPE::NSides-TSHAPE::NCornerNodes; ic++)
        {
            locconorders[ic] = data.fH1ConnectOrders[ic-nedges];
        }
        TPZShapeHCurlNoGrads<TSHAPE>::Initialize(ids,locconorders,data);
    } else {
        DebugStop();
    }
}